

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# starting_basis.cc
# Opt level: O0

void ipx::StartingBasis(Iterate *iterate,Basis *p_basis,Info *info)

{
  bool bVar1;
  uint uVar2;
  BasicStatus BVar3;
  Model *this;
  double *pdVar4;
  double *in_RDX;
  Basis *in_RSI;
  Iterate *in_RDI;
  double dVar5;
  Int j_2;
  Int j_1;
  Int j;
  Timer timer;
  Basis *basis;
  Vector colscale;
  Vector *ub;
  Vector *lb;
  Int n;
  Int m;
  Model *model;
  undefined4 in_stack_fffffffffffffec8;
  Int in_stack_fffffffffffffecc;
  Basis *in_stack_fffffffffffffed0;
  Iterate *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar6;
  Basis *in_stack_fffffffffffffef8;
  Iterate *in_stack_ffffffffffffff00;
  Iterate *in_stack_ffffffffffffff08;
  int local_74;
  int local_70;
  int local_68;
  valarray<double> local_48;
  Vector *local_38;
  Vector *local_30;
  Int local_28;
  Int local_24;
  
  this = Iterate::model(in_RDI);
  local_24 = Model::rows(this);
  local_28 = Model::cols(this);
  local_30 = Model::lb(this);
  local_38 = Model::ub(this);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffed0,
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  *(undefined4 *)((long)in_RDX + 0xc) = 0;
  Timer::Timer((Timer *)in_stack_fffffffffffffed0);
  for (local_68 = 0; local_68 < local_28 + local_24; local_68 = local_68 + 1) {
    dVar5 = Iterate::ScalingFactor
                      (in_stack_ffffffffffffff08,(Int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    pdVar4 = std::valarray<double>::operator[](&local_48,(long)local_68);
    *pdVar4 = dVar5;
    pdVar4 = std::valarray<double>::operator[](local_30,(long)local_68);
    uVar2 = std::isinf(*pdVar4);
    if ((uVar2 & 1) != 0) {
      pdVar4 = std::valarray<double>::operator[](local_38,(long)local_68);
      std::isinf(*pdVar4);
    }
    pdVar4 = std::valarray<double>::operator[](local_30,(long)local_68);
    dVar5 = *pdVar4;
    pdVar4 = std::valarray<double>::operator[](local_38,(long)local_68);
    if ((dVar5 == *pdVar4) && (!NAN(dVar5) && !NAN(*pdVar4))) {
      pdVar4 = std::valarray<double>::operator[](&local_48,(long)local_68);
      *pdVar4 = 0.0;
    }
  }
  std::valarray<double>::operator[](&local_48,0);
  Basis::ConstructBasisFromWeights(in_RSI,in_RDX,(Info *)this);
  if (*(int *)((long)in_RDX + 0xc) == 0) {
    for (local_70 = 0; local_70 < local_28 + local_24; local_70 = local_70 + 1) {
      pdVar4 = std::valarray<double>::operator[](&local_48,(long)local_70);
      if ((*pdVar4 != 0.0) || (NAN(*pdVar4))) {
        pdVar4 = std::valarray<double>::operator[](&local_48,(long)local_70);
        uVar2 = std::isinf(*pdVar4);
        if ((uVar2 & 1) != 0) goto LAB_0085069b;
      }
      else {
LAB_0085069b:
        bVar1 = Basis::IsBasic(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        if (bVar1) {
          Basis::FreeBasicVariable
                    ((Basis *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     (Int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        }
        else {
          Basis::FixNonbasicVariable(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        }
      }
    }
    for (local_74 = 0; local_74 < local_28 + local_24; local_74 = local_74 + 1) {
      pdVar4 = std::valarray<double>::operator[](local_30,(long)local_74);
      in_stack_fffffffffffffef8 = (Basis *)*pdVar4;
      in_stack_ffffffffffffff00 =
           (Iterate *)std::valarray<double>::operator[](local_38,(long)local_74);
      if ((((double)in_stack_fffffffffffffef8 == (double)in_stack_ffffffffffffff00->model_) &&
          (!NAN((double)in_stack_fffffffffffffef8) &&
           !NAN((double)in_stack_ffffffffffffff00->model_))) &&
         (BVar3 = Basis::StatusOf((Basis *)in_stack_fffffffffffffed8,
                                  (Int)((ulong)in_stack_fffffffffffffed0 >> 0x20)),
         BVar3 == NONBASIC_FIXED)) {
        in_stack_fffffffffffffed8 = in_RDI;
        iVar6 = local_74;
        std::valarray<double>::operator[](local_30,(long)local_74);
        Iterate::make_fixed((Iterate *)CONCAT44(iVar6,in_stack_fffffffffffffee0),
                            (Int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                            (double)in_stack_fffffffffffffed0);
      }
    }
    PostprocessDependencies((Iterate *)ub,(Basis *)colscale._M_data,(Info *)colscale._M_size);
    AssertConsistency(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_stack_fffffffffffffed0 = (Basis *)Timer::Elapsed((Timer *)in_stack_fffffffffffffed0);
    in_RDX[0x1f] = (double)in_stack_fffffffffffffed0 + in_RDX[0x1f];
  }
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffed0);
  return;
}

Assistant:

void StartingBasis(Iterate* iterate, Basis* p_basis, Info* info) {
    const Model& model = iterate->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    Vector colscale(n+m);
    Basis& basis = *p_basis;
    info->errflag = 0;
    Timer timer;

    // Construct starting basis. The column weights for the crash procedure are
    // the interior point scaling factors from the current iterate, except that
    // fixed variables get weight zero.
    for (Int j = 0; j < n+m; j++) {
        colscale[j] = iterate->ScalingFactor(j);
        if (std::isinf(lb[j]) && std::isinf(ub[j]))
            assert(colscale[j] == INFINITY);
        else
            assert(std::isfinite(colscale[j]));
        if (lb[j] == ub[j])
            colscale[j] = 0.0;
    }
    basis.ConstructBasisFromWeights(&colscale[0], info);
    if (info->errflag)
        return;

    // Change status of free variables either to BASIC_FREE or NONBASIC_FIXED.
    // Change status of fixed variables either to NONBASIC_FIXED or BASIC_FREE.
    for (Int j = 0; j < n+m; j++) {
        if (colscale[j] == 0.0 || std::isinf(colscale[j])) {
            if (basis.IsBasic(j))
                basis.FreeBasicVariable(j);
            else
                basis.FixNonbasicVariable(j);
        }
    }

    // Variables with equal lower and upper bounds can be removed from the
    // interior point solve if their basic status is NONBASIC_FIXED. Setting
    // x[j] to its bound alters the residual in AI*x=b; this can be ignored
    // because the iterate has not been primal feasible if x[j] was
    // significantly away from its bound.
    for (Int j = 0; j < n+m; j++) {
        if (lb[j] == ub[j] && basis.StatusOf(j) == Basis::NONBASIC_FIXED)
            iterate->make_fixed(j, lb[j]);
    }

    // Linearly dependent rows and columns require adjusting the iterate.
    PostprocessDependencies(iterate, p_basis, info);

    AssertConsistency(*iterate, basis);
    info->time_starting_basis += timer.Elapsed();
}